

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *tgtDir,string *relDir)

{
  size_t __n;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  pointer pcVar6;
  char *__lhs;
  pointer __rhs;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string prefix;
  string outputForExisting;
  string local_c8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  string local_50;
  
  __n = tgtDir->_M_string_length;
  local_a8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  if (__n == relDir->_M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar3 = bcmp((tgtDir->_M_dataplus)._M_p,(relDir->_M_dataplus)._M_p,__n);
    if (iVar3 == 0) {
      return;
    }
  }
  bVar2 = cmLocalGenerator::IsMinGWMake((cmLocalGenerator *)this);
  __lhs = "cd ";
  if (bVar2) {
    __lhs = "cd /d ";
  }
  if (*(char *)((long)&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                       [1].LocalGenerators.
                       super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 2) == '\0') {
    cmOutputConverter::ConvertToOutputForExisting
              (&local_c8,(cmOutputConverter *)this,tgtDir,SHELL,false);
    pcVar6 = (pointer)((ulong)bVar2 * 3 + 3);
    local_80.field_2._M_allocated_capacity = 0;
    local_80.field_2._8_8_ = local_c8._M_string_length;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_80;
    local_80._M_dataplus._M_p = pcVar6;
    local_80._M_string_length = (size_type)__lhs;
    local_58 = &local_c8;
    cmCatViews(&local_a0,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_a8,
             &local_a0);
    cmOutputConverter::ConvertToOutputForExisting
              (&local_50,(cmOutputConverter *)this,relDir,SHELL,false);
    local_80.field_2._M_allocated_capacity = 0;
    local_80.field_2._8_8_ = local_50._M_string_length;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_80;
    local_80._M_dataplus._M_p = pcVar6;
    local_80._M_string_length = (size_type)__lhs;
    local_58 = &local_50;
    cmCatViews(&local_c8,views_00);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_a8,&local_a0);
  }
  else {
    cmOutputConverter::ConvertToOutputForExisting
              (&local_a0,(cmOutputConverter *)this,tgtDir,SHELL,false);
    std::operator+(&local_80,__lhs,&local_a0);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_c8.field_2._M_allocated_capacity = *psVar5;
      local_c8.field_2._8_8_ = plVar4[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar5;
      local_c8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    __rhs = *(pointer *)local_a8;
    pbVar1 = *(pointer *)(local_a8 + 8);
    if (__rhs != pbVar1) {
      do {
        std::operator+(&local_80,&local_c8,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        __rhs = __rhs + 1;
      } while (__rhs != pbVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CreateCDCommand(
  std::vector<std::string>& commands, std::string const& tgtDir,
  std::string const& relDir)
{
  // do we need to cd?
  if (tgtDir == relDir) {
    return;
  }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (!gg->UnixCD) {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd =
      cmStrCat(cd_cmd, this->ConvertToOutputForExisting(tgtDir));
    commands.insert(commands.begin(), cmd);

    // Change back to the starting directory.
    cmd = cmStrCat(cd_cmd, this->ConvertToOutputForExisting(relDir));
    commands.push_back(std::move(cmd));
  } else {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting = this->ConvertToOutputForExisting(tgtDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   [&prefix](std::string const& s) { return prefix + s; });
  }
}